

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O1

bool __thiscall
binlog::PrettyPrinter::printStruct
          (PrettyPrinter *this,OstreamBuffer *out,StructBegin sb,Range *input)

{
  nanoseconds sinceEpoch;
  int64_t v;
  bool bVar1;
  undefined8 uVar2;
  int iVar3;
  char *pcVar4;
  char *in_RCX;
  char *__s;
  ulong uVar5;
  pointer tzname;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (sb.name._len == 0x25) {
    iVar3 = bcmp(sb.name._ptr,"std::chrono::system_clock::time_point",0x25);
    if (((iVar3 == 0) && (sb.tag._len == 5)) && (iVar3 = bcmp(sb.tag._ptr,"`ns\'l",5), iVar3 == 0))
    {
      if (this->_clockSync != (ClockSync *)0x0) {
        local_48 = (undefined1  [16])0x0;
        local_58 = (undefined1  [16])0x0;
        local_68 = (undefined1  [16])0x0;
        local_78 = (undefined1  [16])0x0;
        Range::throw_if_overflow(input,8);
        sinceEpoch.__r = *(rep *)input->_begin;
        input->_begin = (char *)((long)input->_begin + 8);
        if (this->_useLocaltime == true) {
          nsSinceEpochToBrokenDownTimeUTC
                    ((nanoseconds)((long)this->_clockSync->tzOffset * 1000000000 + sinceEpoch.__r),
                     (BrokenDownTime *)local_78);
          iVar3 = this->_clockSync->tzOffset;
          tzname = (this->_clockSync->tzName)._M_dataplus._M_p;
        }
        else {
          nsSinceEpochToBrokenDownTimeUTC(sinceEpoch,(BrokenDownTime *)local_78);
          tzname = "UTC";
          iVar3 = 0;
        }
        printTime(this,out,(BrokenDownTime *)local_78,iVar3,tzname);
        return true;
      }
      return false;
    }
  }
  else if (((sb.name._len == 0xf) && (iVar3 = bcmp(sb.name._ptr,"binlog::address",0xf), iVar3 == 0))
          && (sb.tag._len == 8)) {
    iVar3 = bcmp(sb.tag._ptr,"`value\'L",8);
    if (iVar3 == 0) {
      Range::throw_if_overflow(input,8);
      uVar2 = local_68._0_8_;
      uVar5 = *(ulong *)input->_begin;
      input->_begin = (char *)((long)input->_begin + 8);
      pcVar4 = local_68 + 3;
      local_68._8_8_ = pcVar4;
      in_RCX = pcVar4;
      if (uVar5 == 0) {
        in_RCX = local_68 + 2;
        local_68._0_2_ = (undefined2)uVar2;
        local_68[2] = 0x30;
      }
      else {
        do {
          in_RCX[-1] = "0123456789ABCDEF"[(uint)uVar5 & 0xf];
          in_RCX = in_RCX + -1;
          bVar1 = 0xf < uVar5;
          uVar5 = uVar5 >> 4;
        } while (bVar1);
      }
      local_68._8_8_ = in_RCX;
      detail::OstreamBuffer::write(out,0x1b8733,(void *)0x2,(size_t)in_RCX);
      pcVar4 = pcVar4 + -local_68._8_8_;
      __s = (char *)local_68._8_8_;
      goto LAB_001b4030;
    }
  }
  if ((0x19 < sb.name._len) &&
     (auVar8[0] = -(sb.name._ptr[10] == 'o'), auVar8[1] = -(sb.name._ptr[0xb] == ':'),
     auVar8[2] = -(sb.name._ptr[0xc] == ':'), auVar8[3] = -(sb.name._ptr[0xd] == 'd'),
     auVar8[4] = -(sb.name._ptr[0xe] == 'u'), auVar8[5] = -(sb.name._ptr[0xf] == 'r'),
     auVar8[6] = -(sb.name._ptr[0x10] == 'a'), auVar8[7] = -(sb.name._ptr[0x11] == 't'),
     auVar8[8] = -(sb.name._ptr[0x12] == 'i'), auVar8[9] = -(sb.name._ptr[0x13] == 'o'),
     auVar8[10] = -(sb.name._ptr[0x14] == 'n'), auVar8[0xb] = -(sb.name._ptr[0x15] == '<'),
     auVar8[0xc] = -(sb.name._ptr[0x16] == 'R'), auVar8[0xd] = -(sb.name._ptr[0x17] == 'e'),
     auVar8[0xe] = -(sb.name._ptr[0x18] == 'p'), auVar8[0xf] = -(sb.name._ptr[0x19] == ','),
     auVar6[0] = -(*sb.name._ptr == 's'), auVar6[1] = -(sb.name._ptr[1] == 't'),
     auVar6[2] = -(sb.name._ptr[2] == 'd'), auVar6[3] = -(sb.name._ptr[3] == ':'),
     auVar6[4] = -(sb.name._ptr[4] == ':'), auVar6[5] = -(sb.name._ptr[5] == 'c'),
     auVar6[6] = -(sb.name._ptr[6] == 'h'), auVar6[7] = -(sb.name._ptr[7] == 'r'),
     auVar6[8] = -(sb.name._ptr[8] == 'o'), auVar6[9] = -(sb.name._ptr[9] == 'n'),
     auVar6[10] = -(sb.name._ptr[10] == 'o'), auVar6[0xb] = -(sb.name._ptr[0xb] == ':'),
     auVar6[0xc] = -(sb.name._ptr[0xc] == ':'), auVar6[0xd] = -(sb.name._ptr[0xd] == 'd'),
     auVar6[0xe] = -(sb.name._ptr[0xe] == 'u'), auVar6[0xf] = -(sb.name._ptr[0xf] == 'r'),
     auVar6 = auVar6 & auVar8,
     (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff)) {
    if (*(short *)(sb.name._ptr + (sb.name._len - 2)) == 0x3e6f &&
        *(long *)(sb.name._ptr + (sb.name._len - 10)) == 0x6e616e3a3a647473) {
      __s = "ns";
    }
    else if (*(long *)(sb.name._ptr + (sb.name._len - 8)) == 0x3e6f7263696d3a3a &&
             *(long *)(sb.name._ptr + (sb.name._len - 0xb)) == 0x63696d3a3a647473) {
      __s = "us";
    }
    else if (*(long *)(sb.name._ptr + (sb.name._len - 8)) == 0x3e696c6c696d3a3a &&
             *(long *)(sb.name._ptr + (sb.name._len - 0xb)) == 0x6c696d3a3a647473) {
      __s = "ms";
    }
    else if (*(long *)(sb.name._ptr + (sb.name._len - 8)) == 0x3e3e313c6f697461 &&
             *(long *)(sb.name._ptr + (sb.name._len - 0xe)) == 0x7461723a3a647473) {
      __s = "s";
    }
    else if (*(long *)(sb.name._ptr + (sb.name._len - 8)) == 0x3e3e30363c6f6974 &&
             *(long *)(sb.name._ptr + (sb.name._len - 0xf)) == 0x7461723a3a647473) {
      __s = "m";
    }
    else {
      pcVar4 = sb.name._ptr + (sb.name._len - 0x11);
      auVar7[0] = -(*pcVar4 == 's');
      auVar7[1] = -(pcVar4[1] == 't');
      auVar7[2] = -(pcVar4[2] == 'd');
      auVar7[3] = -(pcVar4[3] == ':');
      auVar7[4] = -(pcVar4[4] == ':');
      auVar7[5] = -(pcVar4[5] == 'r');
      auVar7[6] = -(pcVar4[6] == 'a');
      auVar7[7] = -(pcVar4[7] == 't');
      auVar7[8] = -(pcVar4[8] == 'i');
      auVar7[9] = -(pcVar4[9] == 'o');
      auVar7[10] = -(pcVar4[10] == '<');
      auVar7[0xb] = -(pcVar4[0xb] == '3');
      auVar7[0xc] = -(pcVar4[0xc] == '6');
      auVar7[0xd] = -(pcVar4[0xd] == '0');
      auVar7[0xe] = -(pcVar4[0xe] == '0');
      auVar7[0xf] = -(pcVar4[0xf] == '>');
      auVar9[0] = -(sb.name._ptr[sb.name._len - 1] == '>');
      auVar9[1] = 0xff;
      auVar9[2] = 0xff;
      auVar9[3] = 0xff;
      auVar9[4] = 0xff;
      auVar9[5] = 0xff;
      auVar9[6] = 0xff;
      auVar9[7] = 0xff;
      auVar9[8] = 0xff;
      auVar9[9] = 0xff;
      auVar9[10] = 0xff;
      auVar9[0xb] = 0xff;
      auVar9[0xc] = 0xff;
      auVar9[0xd] = 0xff;
      auVar9[0xe] = 0xff;
      auVar9[0xf] = 0xff;
      auVar9 = auVar9 & auVar7;
      __s = (char *)0x0;
      if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff) {
        __s = "h";
      }
    }
    in_RCX = __s;
    if ((__s != (char *)0x0) && (sb.tag._len == 8)) {
      iVar3 = bcmp(sb.tag._ptr,"`count\'l",8);
      if (iVar3 == 0) {
        Range::throw_if_overflow(input,8);
        v = *(int64_t *)input->_begin;
        input->_begin = (char *)((long)input->_begin + 8);
        detail::OstreamBuffer::writeSigned(out,v);
        pcVar4 = (char *)strlen(__s);
        goto LAB_001b4030;
      }
      iVar3 = bcmp(sb.tag._ptr,"`count\'i",8);
      if (iVar3 == 0) {
        Range::throw_if_overflow(input,4);
        iVar3 = *(int *)input->_begin;
        input->_begin = (char *)((long)input->_begin + 4);
        detail::OstreamBuffer::writeSigned(out,(long)iVar3);
        pcVar4 = (char *)strlen(__s);
        goto LAB_001b4030;
      }
    }
  }
  if (sb.name._len == 0xf) {
    iVar3 = bcmp(sb.name._ptr,"std::error_code",0xf);
    if (iVar3 != 0) {
      return false;
    }
    if (sb.tag._len != 0xb) {
      return false;
    }
    iVar3 = bcmp(sb.tag._ptr,"`message\'[c",0xb);
  }
  else if (sb.name._len == 0x20) {
    iVar3 = bcmp(sb.name._ptr,"std::filesystem::directory_entry",0x20);
    if (iVar3 != 0) {
      return false;
    }
    if (sb.tag._len != 0x24) {
      return false;
    }
    iVar3 = bcmp(sb.tag._ptr,"`path\'{std::filesystem::path`str\'[c}",0x24);
  }
  else {
    if (sb.name._len != 0x15) {
      return false;
    }
    iVar3 = bcmp(sb.name._ptr,"std::filesystem::path",0x15);
    if (iVar3 != 0) {
      return false;
    }
    if (sb.tag._len != 7) {
      return false;
    }
    iVar3 = bcmp(sb.tag._ptr,"`str\'[c",7);
  }
  if (iVar3 != 0) {
    return false;
  }
  Range::throw_if_overflow(input,4);
  pcVar4 = (char *)(ulong)*(uint *)input->_begin;
  input->_begin = (char *)((long)input->_begin + 4);
  Range::throw_if_overflow(input,(size_t)pcVar4);
  __s = input->_begin;
  input->_begin = __s + (long)pcVar4;
LAB_001b4030:
  detail::OstreamBuffer::write(out,(int)__s,pcVar4,(size_t)in_RCX);
  return true;
}

Assistant:

bool PrettyPrinter::printStruct(detail::OstreamBuffer& out, mserialize::Visitor::StructBegin sb, Range& input) const
{
  if (sb.name == "binlog::address" && sb.tag == "`value'L")
  {
    const std::uint64_t value = input.read<std::uint64_t>();
    mserialize::detail::IntegerToHex tohex;
    tohex.visit(value);
    out << "0x" << tohex.value();
    return true;
  }

  if (sb.name == "std::chrono::system_clock::time_point" && sb.tag == "`ns'l")
  {
    if (_clockSync == nullptr) { return false; }

    BrokenDownTime bdt{};
    const auto sinceEpoch = std::chrono::nanoseconds{input.read<std::int64_t>()};

    if (_useLocaltime)
    {
      const std::chrono::nanoseconds sinceEpochTz = sinceEpoch + std::chrono::seconds{_clockSync->tzOffset};
      nsSinceEpochToBrokenDownTimeUTC(sinceEpochTz, bdt);
      printTime(out, bdt, _clockSync->tzOffset, _clockSync->tzName.data());
    }
    else
    {
      nsSinceEpochToBrokenDownTimeUTC(sinceEpoch, bdt);
      printTime(out, bdt, 0, "UTC");
    }
    return true;
  }

  if (sb.name.starts_with("std::chrono::duration<Rep,"))
  {
    const char* suffix =
      sb.name.ends_with("std::nano>") ? "ns" :
      sb.name.ends_with("std::micro>") ? "us" :
      sb.name.ends_with("std::milli>") ? "ms" :
      sb.name.ends_with("std::ratio<1>>") ? "s" :
      sb.name.ends_with("std::ratio<60>>") ? "m" :
      sb.name.ends_with("std::ratio<3600>>") ? "h" :
      nullptr;
    if (suffix != nullptr)
    {
      if (sb.tag == "`count'l")
      {
        const std::int64_t count = input.read<std::int64_t>();
        out << count << suffix;
        return true;
      }
      if (sb.tag == "`count'i") // on MSVC, for minutes and hours
      {
        const std::int32_t count = input.read<std::int32_t>();
        out << count << suffix;
        return true;
      }
    }
  }

  if ((sb.name == "std::filesystem::path" && sb.tag == "`str'[c")
  || (sb.name == "std::filesystem::directory_entry" && sb.tag == "`path'{std::filesystem::path`str'[c}")
  || (sb.name == "std::error_code" && sb.tag == "`message'[c")
  ) {
    const std::uint32_t size = input.read<std::uint32_t>();
    out.write(input.view(size), size);
    return true;
  }

  return false;
}